

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall
anon_unknown.dwarf_3ed9ed6::InferPubkey
          (anon_unknown_dwarf_3ed9ed6 *this,CPubKey *pubkey,ParseScriptContext ctx,
          SigningProvider *provider)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  pointer __p;
  long in_FS_OFFSET;
  undefined1 local_7c [4];
  long *local_78;
  KeyOriginInfo info;
  CKeyID local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CPubKey::IsValidNonHybrid(pubkey);
  if ((bVar2) && ((ctx < P2WPKH || ((pubkey->vch[0] & 0xfe) == 2)))) {
    plVar4 = (long *)operator_new(0x50);
    *(undefined4 *)(plVar4 + 1) = 0;
    *plVar4 = (long)&PTR__PubkeyProvider_01149e18;
    memcpy((void *)((long)plVar4 + 0xc),pubkey,0x41);
    *(undefined1 *)((long)plVar4 + 0x4d) = 0;
    info.fingerprint[0] = '\0';
    info.fingerprint[1] = '\0';
    info.fingerprint[2] = '\0';
    info.fingerprint[3] = '\0';
    info._4_4_ = 0;
    local_78 = plVar4;
    std::
    unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                   *)&info);
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CPubKey::GetID(&local_50,pubkey);
    iVar3 = (*provider->_vptr_SigningProvider[7])(provider,&local_50,&info);
    if ((char)iVar3 == '\0') {
      *(long **)this = plVar4;
      plVar4 = (long *)0x0;
    }
    else {
      local_7c[0] = '\0';
      local_7c[1] = '\0';
      local_7c[2] = '\0';
      local_7c[3] = '\0';
      std::
      make_unique<(anonymous_namespace)::OriginPubkeyProvider,int,KeyOriginInfo,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,bool>
                ((int *)&local_50,(KeyOriginInfo *)local_7c,
                 (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)&info,(bool *)&local_78);
      uVar1 = local_50.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_;
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
      local_50.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
      *(undefined8 *)this = uVar1;
      std::
      unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                     *)&local_50);
      plVar4 = local_78;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferPubkey(const CPubKey& pubkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    // Key cannot be hybrid
    if (!pubkey.IsValidNonHybrid()) {
        return nullptr;
    }
    // Uncompressed is only allowed in TOP and P2SH contexts
    if (ctx != ParseScriptContext::TOP && ctx != ParseScriptContext::P2SH && !pubkey.IsCompressed()) {
        return nullptr;
    }
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, false);
    KeyOriginInfo info;
    if (provider.GetKeyOrigin(pubkey.GetID(), info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}